

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::write_int<int>(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 *this,int value,format_specs *spec)

{
  byte bVar1;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int> local_38
  ;
  
  local_38.out.container = (this->out_).container;
  local_38.locale.locale_ = (this->locale_).locale_;
  local_38.prefix_size = 0;
  if (value < 0) {
    local_38.prefix[0] = '-';
    local_38.prefix_size = 1;
    local_38.abs_value = -value;
  }
  else {
    bVar1 = (byte)spec->field_0x9 >> 4 & 7;
    local_38.abs_value = value;
    if (1 < bVar1) {
      local_38.prefix[0] = ' ';
      if (bVar1 == 2) {
        local_38.prefix[0] = '+';
      }
      local_38.prefix_size = 1;
    }
  }
  local_38.specs = spec;
  handle_int_type_spec<fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>&>
            (spec->type,&local_38);
  (this->out_).container = local_38.out.container;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }